

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

_Bool cf_hc_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  int *piVar1;
  ulong uVar2;
  long *plVar3;
  int *piVar4;
  char cVar5;
  _Bool _Var6;
  ulong uVar7;
  
  if ((cf->field_0x24 & 1) != 0) {
    _Var6 = (*cf->next->cft->has_data_pending)(cf->next,data);
    return _Var6;
  }
  piVar1 = (int *)cf->ctx;
  uVar7 = 0;
  piVar4 = piVar1;
  while( true ) {
    uVar2 = *(ulong *)(piVar1 + 0x26);
    if (uVar2 <= uVar7) break;
    plVar3 = *(long **)(piVar4 + 0xc);
    if ((plVar3 != (long *)0x0) && (piVar4[0xe] == 0)) {
      cVar5 = (**(code **)(*plVar3 + 0x40))(plVar3,data);
      if (cVar5 != '\0') break;
    }
    uVar7 = uVar7 + 1;
    piVar4 = piVar4 + 0xe;
  }
  return uVar7 < uVar2;
}

Assistant:

static bool cf_hc_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  for(i = 0; i < ctx->baller_count; i++)
    if(cf_hc_baller_data_pending(&ctx->ballers[i], data))
      return TRUE;
  return FALSE;
}